

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::AssemblyContext::recordTypeDefinition(AssemblyContext *this,spv_instruction_t *pInst)

{
  spv_id_to_type_map *this_00;
  uint32_t uVar1;
  uint uVar2;
  pointer puVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  uint32_t value;
  uint local_1fc;
  DiagnosticStream local_1f8;
  
  local_1fc = (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[1];
  this_00 = &this->types_;
  iVar4 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,&local_1fc);
  if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::IdType>,_false>._M_cur
      == (__node_type *)0x0) {
    if (pInst->opcode == OpTypeFloat) {
      puVar3 = (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (1 < ((long)(pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) - 3U) {
        diagnostic(&local_1f8,this);
        pcVar6 = "Invalid OpTypeFloat instruction";
        goto LAB_001778fa;
      }
      uVar1 = puVar3[2];
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_1fc);
      pmVar5->bitwidth = uVar1;
      pmVar5->isSigned = false;
      pmVar5->type_class = kScalarFloatType;
    }
    else if (pInst->opcode == OpTypeInt) {
      puVar3 = (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 != 0x10) {
        diagnostic(&local_1f8,this);
        pcVar6 = "Invalid OpTypeInt instruction";
        goto LAB_001778fa;
      }
      uVar1 = puVar3[2];
      uVar2 = puVar3[3];
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_1fc);
      pmVar5->bitwidth = uVar1;
      pmVar5->isSigned = uVar2 != 0;
      pmVar5->type_class = kScalarIntegerType;
    }
    else {
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_1fc);
      pmVar5->bitwidth = 0;
      pmVar5->isSigned = false;
      pmVar5->type_class = kOtherType;
    }
    local_1f8.error_ = SPV_SUCCESS;
  }
  else {
    diagnostic(&local_1f8,this);
    std::operator<<((ostream *)&local_1f8,"Value ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1f8);
    pcVar6 = " has already been used to generate a type";
LAB_001778fa:
    std::operator<<((ostream *)&local_1f8,pcVar6);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  return local_1f8.error_;
}

Assistant:

spv_result_t AssemblyContext::recordTypeDefinition(
    const spv_instruction_t* pInst) {
  uint32_t value = pInst->words[1];
  if (types_.find(value) != types_.end()) {
    return diagnostic() << "Value " << value
                        << " has already been used to generate a type";
  }

  if (pInst->opcode == spv::Op::OpTypeInt) {
    if (pInst->words.size() != 4)
      return diagnostic() << "Invalid OpTypeInt instruction";
    types_[value] = {pInst->words[2], pInst->words[3] != 0,
                     IdTypeClass::kScalarIntegerType};
  } else if (pInst->opcode == spv::Op::OpTypeFloat) {
    if ((pInst->words.size() != 3) && (pInst->words.size() != 4))
      return diagnostic() << "Invalid OpTypeFloat instruction";
    // TODO(kpet) Do we need to record the FP Encoding here?
    types_[value] = {pInst->words[2], false, IdTypeClass::kScalarFloatType};
  } else {
    types_[value] = {0, false, IdTypeClass::kOtherType};
  }
  return SPV_SUCCESS;
}